

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TableauPile.cpp
# Opt level: O0

void __thiscall
solitaire::piles::TableauPile::Snapshot::Snapshot
          (Snapshot *this,shared_ptr<solitaire::piles::TableauPile> *tableauPile,Cards *pileCards,
          uint topCoveredCardPosition)

{
  uint topCoveredCardPosition_local;
  Cards *pileCards_local;
  shared_ptr<solitaire::piles::TableauPile> *tableauPile_local;
  Snapshot *this_local;
  
  archivers::interfaces::Snapshot::Snapshot(&this->super_Snapshot);
  (this->super_Snapshot)._vptr_Snapshot = (_func_int **)&PTR__Snapshot_00150af8;
  std::shared_ptr<solitaire::piles::TableauPile>::shared_ptr(&this->tableauPile,tableauPile);
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            (&this->pileCards,pileCards);
  this->topCoveredCardPosition = topCoveredCardPosition;
  return;
}

Assistant:

TableauPile::Snapshot::Snapshot(
    std::shared_ptr<TableauPile> tableauPile,
    Cards pileCards, unsigned topCoveredCardPosition):
    tableauPile {std::move(tableauPile)},
    pileCards {std::move(pileCards)},
    topCoveredCardPosition {std::move(topCoveredCardPosition)} {
}